

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void int32_suite::test_one(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  encoder_type encoder;
  undefined8 local_60;
  void *local_58;
  long lStack_50;
  long local_48;
  undefined4 local_3c;
  undefined **local_38 [5];
  
  local_38[1] = (undefined **)&local_58;
  local_58 = (void *)0x0;
  lStack_50 = 0;
  local_48 = 0;
  local_38[0] = &PTR__base_00112d48;
  local_60 = trial::protocol::bintoken::detail::basic_encoder<24UL>::value
                       ((basic_encoder<24UL> *)local_38,1);
  local_3c = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::int32_t(1))","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x136,"void int32_suite::test_one()",&local_60,&local_3c);
  local_60 = lStack_50 - (long)local_58;
  local_3c = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x137,"void int32_suite::test_one()",&local_60,&local_3c);
  local_60._0_4_ = 0xc4;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("buffer[0]","token::code::int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x138,"void int32_suite::test_one()",local_58,&local_60);
  local_60._0_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[1]","0x01",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x139,"void int32_suite::test_one()",(long)local_58 + 1,&local_60);
  local_60._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[2]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x13a,"void int32_suite::test_one()",(long)local_58 + 2,&local_60);
  local_60._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[3]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x13b,"void int32_suite::test_one()",(long)local_58 + 3,&local_60);
  local_60 = (ulong)local_60._4_4_ << 0x20;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[4]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x13c,"void int32_suite::test_one()",(long)local_58 + 4,&local_60);
  (*(code *)*local_38[0])();
  if (local_58 != (void *)0x0) {
    operator_delete(local_58,local_48 - (long)local_58);
  }
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}